

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool mjs::interpreter::impl::handle_completion(completion *c,label_set *labels)

{
  bool bVar1;
  bool bVar2;
  completion local_58;
  
  bVar2 = true;
  switch(c->type) {
  case break_:
    bVar1 = completion::in_set(c,labels);
    if (bVar1) {
      completion::completion(&local_58,(value *)&value::undefined,normal);
      c->type = local_58.type;
      value::operator=(&c->result,&local_58.result);
      (c->target)._M_len = local_58.target._M_len;
      (c->target)._M_str = local_58.target._M_str;
      value::destroy(&local_58.result);
    }
    break;
  case continue_:
    bVar2 = completion::in_set(c,labels);
    if (!bVar2) {
      return true;
    }
    completion::completion(&local_58,(value *)&value::undefined,normal);
    c->type = local_58.type;
    value::operator=(&c->result,&local_58.result);
    (c->target)._M_len = local_58.target._M_len;
    (c->target)._M_str = local_58.target._M_str;
    value::destroy(&local_58.result);
  case normal:
    bVar2 = false;
    break;
  case return_:
  case throw_:
    break;
  default:
    __assert_fail("c.type == completion_type::normal",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x371,
                  "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                 );
  }
  return bVar2;
}

Assistant:

static bool handle_completion(completion& c, const label_set& labels) {
        if (c.type == completion_type::break_) {
            assert(c.has_target());
            if (c.in_set(labels)) {
                c = completion{};
            }
            return true;
        } else if (c.type == completion_type::return_ || c.type == completion_type::throw_) {
            return true;
        } else if (c.type == completion_type::continue_) {
            assert(c.has_target());
            if (!c.in_set(labels)) {
                return true;
            }
            c = completion{};
        } else {
            assert(c.type == completion_type::normal);
        }
        return false;
    }